

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Battle.cpp
# Opt level: O0

void __thiscall Battle::showStats(Battle *this,Player *player)

{
  ostream *poVar1;
  undefined1 local_38 [40];
  Player *player_local;
  Battle *this_local;
  
  local_38._32_8_ = player;
  player_local = (Player *)this;
  UI::clearScreen();
  Player::getName_abi_cxx11_((Player *)local_38);
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)local_38);
  poVar1 = std::operator<<(poVar1," won this battle! Congratulations!");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)local_38);
  Keyboard::getch();
  return;
}

Assistant:

void Battle::showStats(Player & player) {
    UI::clearScreen();
    std::cout << player.getName() << " won this battle! Congratulations!" << std::endl;
    Keyboard::getch();
}